

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

longlong __thiscall fmt::v7::file::size(file *this)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  string_view local_b0;
  undefined1 local_a0 [8];
  Stat file_stat;
  file *this_local;
  
  file_stat.__glibc_reserved[2] = (__syscall_slong_t)this;
  memset(local_a0,0,0x90);
  iVar1 = fstat(this->fd_,(stat *)local_a0);
  if (iVar1 == -1) {
    this_00 = (system_error *)__cxa_allocate_exception(0x18);
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    basic_string_view<char>::basic_string_view(&local_b0,"cannot get file attributes");
    system_error::system_error<>(this_00,iVar1,local_b0);
    __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
  }
  return file_stat.st_rdev;
}

Assistant:

long long file::size() const {
#  ifdef _WIN32
  // Use GetFileSize instead of GetFileSizeEx for the case when _WIN32_WINNT
  // is less than 0x0500 as is the case with some default MinGW builds.
  // Both functions support large file sizes.
  DWORD size_upper = 0;
  HANDLE handle = reinterpret_cast<HANDLE>(_get_osfhandle(fd_));
  DWORD size_lower = FMT_SYSTEM(GetFileSize(handle, &size_upper));
  if (size_lower == INVALID_FILE_SIZE) {
    DWORD error = GetLastError();
    if (error != NO_ERROR)
      FMT_THROW(windows_error(GetLastError(), "cannot get file size"));
  }
  unsigned long long long_size = size_upper;
  return (long_size << sizeof(DWORD) * CHAR_BIT) | size_lower;
#  else
  using Stat = struct stat;
  Stat file_stat = Stat();
  if (FMT_POSIX_CALL(fstat(fd_, &file_stat)) == -1)
    FMT_THROW(system_error(errno, "cannot get file attributes"));
  static_assert(sizeof(long long) >= sizeof(file_stat.st_size),
                "return type of file::size is not large enough");
  return file_stat.st_size;
#  endif
}